

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaInfo.hpp
# Opt level: O2

SchemaInfo * __thiscall xercesc_4_0::SchemaInfo::getImportInfo(SchemaInfo *this,uint namespaceURI)

{
  SchemaInfo *pSVar1;
  XMLSize_t i;
  XMLSize_t getAt;
  XMLSize_t XVar2;
  
  if (this->fImportedInfoList == (RefVectorOf<xercesc_4_0::SchemaInfo> *)0x0) {
    XVar2 = 0;
  }
  else {
    XVar2 = (this->fImportedInfoList->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fCurCount;
  }
  getAt = 0;
  do {
    if (XVar2 == getAt) {
      return (SchemaInfo *)0x0;
    }
    pSVar1 = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::elementAt
                       (&this->fImportedInfoList->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>,
                        getAt);
    getAt = getAt + 1;
  } while (pSVar1->fTargetNSURI != namespaceURI);
  return pSVar1;
}

Assistant:

inline SchemaInfo* SchemaInfo::getImportInfo(const unsigned int namespaceURI) const {

    XMLSize_t importSize = (fImportedInfoList) ? fImportedInfoList->size() : 0;
    SchemaInfo* currInfo = 0;

    for (XMLSize_t i=0; i < importSize; i++) {

        currInfo = fImportedInfoList->elementAt(i);

        if (currInfo->getTargetNSURI() == (int) namespaceURI)
            return currInfo;
    }

    return 0;
}